

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

tm * el::base::utils::DateTime::buildTimeInfo(timeval *currTime,tm *timeInfo)

{
  __time_t local_20;
  time_t rawTime;
  tm *timeInfo_local;
  timeval *currTime_local;
  
  local_20 = currTime->tv_sec;
  rawTime = (time_t)timeInfo;
  timeInfo_local = (tm *)currTime;
  localtime_r(&local_20,(tm *)timeInfo);
  return (tm *)rawTime;
}

Assistant:

struct ::tm* DateTime::buildTimeInfo(struct timeval* currTime, struct ::tm* timeInfo) {
#if ELPP_OS_UNIX
  time_t rawTime = currTime->tv_sec;
  ::elpptime_r(&rawTime, timeInfo);
  return timeInfo;
#else
#  if ELPP_COMPILER_MSVC
  ELPP_UNUSED(currTime);
  time_t t;
#    if defined(_USE_32BIT_TIME_T)
  _time32(&t);
#    else
  _time64(&t);
#    endif
  elpptime_s(timeInfo, &t);
  return timeInfo;
#  else
  // For any other compilers that don't have CRT warnings issue e.g, MinGW or TDM GCC- we use different method
  time_t rawTime = currTime->tv_sec;
  struct tm* tmInf = elpptime(&rawTime);
  *timeInfo = *tmInf;
  return timeInfo;
#  endif  // ELPP_COMPILER_MSVC
#endif  // ELPP_OS_UNIX
}